

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

Dependency * __thiscall
kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>
          (Vector<capnp::_::RawBrandedSchema::Dependency> *this)

{
  bool bVar1;
  Dependency *pDVar2;
  Vector<capnp::_::RawBrandedSchema::Dependency> *this_local;
  
  bVar1 = ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  pDVar2 = ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::add<>(&this->builder);
  return pDVar2;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }